

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall QMainWindowTabBar::mouseMoveEvent(QMainWindowTabBar *this,QMouseEvent *e)

{
  QTabBarPrivate *this_00;
  int *piVar1;
  QMovableTabWidget *pQVar2;
  QDockWidgetPrivate *this_01;
  QWidgetData *pQVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  DockOptions DVar7;
  int iVar8;
  int iVar9;
  DockWidgetFeatures DVar10;
  QObject *pQVar11;
  long lVar12;
  QLayout *pQVar13;
  QWidget *pQVar14;
  Representation RVar15;
  long lVar16;
  QWidget *this_02;
  long in_FS_OFFSET;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  QPoint local_50;
  QPoint local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabBarPrivate **)(this + 8);
  if ((((*(long *)(this + 0x30) == 0) || (*(int *)(*(long *)(this + 0x30) + 4) == 0)) ||
      (*(long *)(this + 0x38) == 0)) &&
     (DVar7 = QMainWindow::dockOptions(*(QMainWindow **)(this + 0x28)),
     ((uint)DVar7.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
            super_QFlagsStorage<QMainWindow::DockOption>.i & 0x20) != 0)) {
    iVar8 = QApplication::startDragDistance();
    iVar9 = iVar8 * 3 + 3;
    lVar12 = *(long *)(this + 0x20);
    RVar15.m_i = iVar8 * -3 + -3;
    local_48.yp.m_i = RVar15.m_i;
    local_48.xp.m_i = RVar15.m_i;
    local_40 = CONCAT44((iVar9 + *(int *)(lVar12 + 0x20)) - *(int *)(lVar12 + 0x18),
                        (*(int *)(lVar12 + 0x1c) + iVar9) - *(int *)(lVar12 + 0x14));
    if ((*(uint *)&this_00->field_0x2d0 >> 9 & 1) != 0) {
      auVar19 = QEventPoint::position();
      dVar17 = (double)((ulong)auVar19._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar19._0_8_;
      dVar18 = dVar17;
      if (dVar17 <= -2147483648.0) {
        dVar18 = -2147483648.0;
      }
      local_50.xp.m_i =
           (int)(double)(-(ulong)(2147483647.0 < dVar17) & 0x41dfffffffc00000 |
                        ~-(ulong)(2147483647.0 < dVar17) & (ulong)dVar18);
      dVar17 = (double)((ulong)auVar19._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar19._8_8_;
      dVar18 = dVar17;
      if (dVar17 <= -2147483648.0) {
        dVar18 = -2147483648.0;
      }
      local_50.yp.m_i =
           (int)(double)(-(ulong)(2147483647.0 < dVar17) & 0x41dfffffffc00000 |
                        ~-(ulong)(2147483647.0 < dVar17) & (ulong)dVar18);
      cVar6 = QRect::contains(&local_48,SUB81(&local_50,0));
      if (cVar6 == '\0') {
        iVar8 = this_00->pressedIndex;
        if ((-1 < (long)iVar8) && ((ulong)(long)iVar8 < (ulong)(this_00->tabList).d.size)) {
          pQVar11 = (QObject *)dockAt(this,iVar8);
          if (pQVar11 == (QObject *)0x0) {
            lVar12 = 0;
          }
          else {
            lVar12 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar11);
          }
          piVar1 = *(int **)(this + 0x30);
          *(long *)(this + 0x30) = lVar12;
          *(QObject **)(this + 0x38) = pQVar11;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              operator_delete(piVar1);
            }
            lVar12 = *(long *)(this + 0x30);
          }
          if (((lVar12 != 0) && (*(int *)(lVar12 + 4) != 0)) && (*(long *)(this + 0x38) != 0)) {
            QTabBarPrivate::moveTabFinished(this_00,this_00->pressedIndex);
            this_00->pressedIndex = -1;
            pQVar2 = this_00->movingTab;
            if (pQVar2 != (QMovableTabWidget *)0x0) {
              (**(code **)(*(long *)&pQVar2->super_QWidget + 0x68))(pQVar2,0);
            }
            (this_00->dragStartPosition).xp = 0;
            (this_00->dragStartPosition).yp = 0;
            this_01 = *(QDockWidgetPrivate **)&(*(QWidget **)(this + 0x38))->field_0x8;
            pQVar13 = QWidget::layout(*(QWidget **)(this + 0x38));
            lVar12 = *(long *)&pQVar13[1].super_QLayoutItem.align;
            lVar16 = (long)(int)*(long *)(pQVar13 + 2) + (long)(int)lVar12;
            lVar12 = (*(long *)(pQVar13 + 2) >> 0x20) + (lVar12 >> 0x20);
            local_50 = (QPoint)((ulong)(lVar16 - (lVar16 >> 0x3f)) >> 1 & 0xffffffff |
                               (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) << 0x1f);
            QDockWidgetPrivate::initDrag(this_01,&local_50,true);
            QDockWidgetPrivate::startDrag(this_01,Widget);
            if (this_01->state != (DragState *)0x0) {
              this_01->state->ctrlDrag = (bool)((byte)((uint)*(undefined4 *)(e + 0x20) >> 0x1a) & 1)
              ;
            }
          }
        }
      }
    }
  }
  if ((((*(long *)(this + 0x30) != 0) &&
       (*(long *)(this + 0x38) != 0 && *(int *)(*(long *)(this + 0x30) + 4) != 0)) &&
      (lVar12 = *(long *)(*(long *)(*(long *)(this + 0x38) + 8) + 600), lVar12 != 0)) &&
     (*(char *)(lVar12 + 0x18) == '\x01')) {
    auVar19 = QEventPoint::globalPosition();
    dVar18 = (double)((ulong)auVar19._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar19._0_8_;
    bVar4 = 2147483647.0 < dVar18;
    if (dVar18 <= -2147483648.0) {
      dVar18 = -2147483648.0;
    }
    dVar17 = (double)((ulong)auVar19._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar19._8_8_;
    bVar5 = 2147483647.0 < dVar17;
    if (dVar17 <= -2147483648.0) {
      dVar17 = -2147483648.0;
    }
    if ((*(long *)(this + 0x30) == 0) || (*(int *)(*(long *)(this + 0x30) + 4) == 0)) {
      this_02 = (QWidget *)0x0;
    }
    else {
      this_02 = *(QWidget **)(this + 0x38);
    }
    pQVar14 = QDockWidget::titleBarWidget((QDockWidget *)this_02);
    if (pQVar14 == (QWidget *)0x0) {
      DVar10 = QDockWidget::features((QDockWidget *)this_02);
      if (((uint)DVar10.super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                 super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 8) == 0) {
        iVar8 = (this_02->data->crect).x2.m_i - (this_02->data->crect).x1.m_i;
        iVar8 = (iVar8 - (iVar8 + 1 >> 0x1f)) + 1 >> 1;
        iVar9 = QApplication::startDragDistance();
      }
      else {
        iVar8 = QApplication::startDragDistance();
        iVar9 = (this_02->data->crect).y2.m_i - (this_02->data->crect).y1.m_i;
        iVar9 = (iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1;
      }
    }
    else {
      pQVar3 = pQVar14->data;
      iVar8 = ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) / 2;
      iVar9 = ((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) / 2;
    }
    local_48.xp.m_i =
         (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar18) - iVar8;
    local_48.yp.m_i =
         (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar17) - iVar9;
    QWidget::move(this_02,&local_48);
  }
  QTabBar::mouseMoveEvent((QTabBar *)this,e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowTabBar::mouseMoveEvent(QMouseEvent *e)
{
    // The QTabBar handles the moving (reordering) of tabs.
    // When QTabBarPrivate::dragInProgress is true, and that the mouse is outside of a region
    // around the QTabBar, we will consider the user wants to drag that QDockWidget away from this
    // tab area.

    QTabBarPrivate *d = static_cast<QTabBarPrivate*>(d_ptr.data());
    if (!draggingDock && (mainWindow->dockOptions() & QMainWindow::GroupedDragging)) {
        int offset = QApplication::startDragDistance() + 1;
        offset *= 3;
        QRect r = rect().adjusted(-offset, -offset, offset, offset);
        if (d->dragInProgress && !r.contains(e->position().toPoint()) && d->validIndex(d->pressedIndex)) {
            draggingDock = dockAt(d->pressedIndex);
            if (draggingDock) {
                // We should drag this QDockWidget away by unpluging it.
                // First cancel the QTabBar's internal move
                d->moveTabFinished(d->pressedIndex);
                d->pressedIndex = -1;
                if (d->movingTab)
                    d->movingTab->setVisible(false);
                d->dragStartPosition = QPoint();

                // Then starts the drag using QDockWidgetPrivate's API
                QDockWidgetPrivate *dockPriv = static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(draggingDock));
                QDockWidgetLayout *dwlayout = static_cast<QDockWidgetLayout *>(draggingDock->layout());
                dockPriv->initDrag(dwlayout->titleArea().center(), true);
                dockPriv->startDrag(QDockWidgetPrivate::DragScope::Widget);
                if (dockPriv->state)
                    dockPriv->state->ctrlDrag = e->modifiers() & Qt::ControlModifier;
            }
        }
    }

    if (draggingDock) {
        QDockWidgetPrivate *dockPriv = static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(draggingDock));
        if (dockPriv->state && dockPriv->state->dragging) {
            // move will call QMainWindowLayout::hover
            moveToUnplugPosition(e->globalPosition().toPoint(), draggingDock);
        }
    }
    QTabBar::mouseMoveEvent(e);
}